

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

int uv__udp_disconnect(uv_udp_t *handle)

{
  byte *pbVar1;
  int iVar2;
  int *piVar3;
  sockaddr local_28;
  
  piVar3 = __errno_location();
  local_28.sa_family = 0;
  local_28.sa_data[0] = '\0';
  local_28.sa_data[1] = '\0';
  local_28.sa_data[2] = '\0';
  local_28.sa_data[3] = '\0';
  local_28.sa_data[4] = '\0';
  local_28.sa_data[5] = '\0';
  local_28.sa_data[6] = '\0';
  local_28.sa_data[7] = '\0';
  local_28.sa_data[8] = '\0';
  local_28.sa_data[9] = '\0';
  local_28.sa_data[10] = '\0';
  local_28.sa_data[0xb] = '\0';
  local_28.sa_data[0xc] = '\0';
  local_28.sa_data[0xd] = '\0';
  do {
    *piVar3 = 0;
    iVar2 = connect((handle->io_watcher).fd,&local_28,0x10);
    if (iVar2 != -1) goto LAB_0011d045;
    iVar2 = *piVar3;
  } while (iVar2 == 4);
  if (iVar2 == 0x61) {
LAB_0011d045:
    pbVar1 = (byte *)((long)&handle->flags + 3);
    *pbVar1 = *pbVar1 & 0xfd;
    iVar2 = 0;
  }
  else {
    iVar2 = -iVar2;
  }
  return iVar2;
}

Assistant:

int uv__udp_disconnect(uv_udp_t* handle) {
    int r;
    struct sockaddr addr;

    memset(&addr, 0, sizeof(addr));

    addr.sa_family = AF_UNSPEC;

    do {
      errno = 0;
      r = connect(handle->io_watcher.fd, &addr, sizeof(addr));
    } while (r == -1 && errno == EINTR);

    if (r == -1 && errno != EAFNOSUPPORT)
      return UV__ERR(errno);

    handle->flags &= ~UV_HANDLE_UDP_CONNECTED;
    return 0;
}